

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O3

void __thiscall Preprocessor::parseDefineArguments(Preprocessor *this,Macro *m)

{
  Symbol *pSVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  Symbol *pSVar5;
  long lVar6;
  Token *pTVar7;
  char *pcVar8;
  int iVar9;
  long in_FS_OFFSET;
  Symbol arg;
  QByteArray local_c0;
  undefined8 local_a8;
  QArrayData *pQStack_a0;
  char *local_98;
  qsizetype qStack_90;
  qsizetype local_88;
  qsizetype qStack_80;
  QByteArray local_78;
  QArrayDataPointer<Symbol> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (Symbol *)0x0;
  local_58.size = 0;
  do {
    lVar4 = (this->super_Parser).symbols.d.size;
    lVar6 = (this->super_Parser).index;
    if (lVar4 <= lVar6) break;
    pSVar5 = (this->super_Parser).symbols.d.ptr;
    pTVar7 = &pSVar5[lVar6].token;
    do {
      if (*pTVar7 != PP_WHITESPACE) {
        bVar2 = lVar6 < lVar4;
        lVar4 = lVar6;
        if (bVar2) {
          lVar4 = lVar6 + 1;
          (this->super_Parser).index = lVar4;
          if (*pTVar7 == IDENTIFIER) goto LAB_00140827;
          if (*pTVar7 == PP_RPAREN) goto LAB_00140a74;
        }
        break;
      }
      lVar6 = lVar6 + 1;
      (this->super_Parser).index = lVar6;
      pTVar7 = pTVar7 + 0xc;
    } while (lVar4 != lVar6);
    local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::mid(&local_78,&pSVar5[lVar4 + -1].lex,pSVar5[lVar4 + -1].from,pSVar5[lVar4 + -1].len
                   );
    local_a8 = "...";
    bVar2 = operator==(&local_78,(char **)&local_a8);
    if (!bVar2) {
      pcVar8 = local_78.d.ptr;
      if (local_78.d.ptr == (char *)0x0) {
        pcVar8 = "";
      }
      bVar3 = is_identifier(pcVar8,local_78.d.size);
      iVar9 = 0;
      if (bVar3) goto LAB_001407f3;
LAB_00140b0a:
      pcVar8 = "Unexpected character in macro argument list.";
LAB_00140b02:
      Parser::error(&this->super_Parser,pcVar8);
    }
    m->isVariadic = true;
    iVar9 = (this->super_Parser).symbols.d.ptr[(this->super_Parser).index + -1].lineNum;
    QByteArray::QByteArray(&local_c0,"__VA_ARGS__",-1);
    local_a8 = (char *)CONCAT44(1,iVar9);
    pQStack_a0 = &(local_c0.d.d)->super_QArrayData;
    local_98 = local_c0.d.ptr;
    qStack_90 = local_c0.d.size;
    if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_88 = 0;
    qStack_80 = local_c0.d.size;
    QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol>
              ((QMovableArrayOps<Symbol> *)&local_58,local_58.size,(Symbol *)&local_a8);
    QList<Symbol>::end((QList<Symbol> *)&local_58);
    if (pQStack_a0 != (QArrayData *)0x0) {
      LOCK();
      (pQStack_a0->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQStack_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQStack_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQStack_a0,1,0x10);
      }
    }
    if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,1,0x10);
      }
    }
    lVar6 = (this->super_Parser).symbols.d.size;
    lVar4 = (this->super_Parser).index;
    if (lVar4 < lVar6) {
      pTVar7 = &(this->super_Parser).symbols.d.ptr[lVar4].token;
      while (*pTVar7 == PP_WHITESPACE) {
        lVar4 = lVar4 + 1;
        (this->super_Parser).index = lVar4;
        pTVar7 = pTVar7 + 0xc;
        if (lVar6 == lVar4) goto LAB_00140afb;
      }
    }
    if ((lVar6 <= lVar4) || ((this->super_Parser).symbols.d.ptr[lVar4].token != PP_RPAREN)) {
LAB_00140afb:
      pcVar8 = "missing \')\' in macro argument list";
      goto LAB_00140b02;
    }
    (this->super_Parser).index = lVar4 + 1;
    iVar9 = 3;
LAB_001407f3:
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (!bVar2) {
      pSVar5 = (this->super_Parser).symbols.d.ptr;
      lVar4 = (this->super_Parser).index;
LAB_00140827:
      pSVar1 = local_58.ptr;
      local_a8 = *(char **)(pSVar5 + lVar4 + -1);
      pQStack_a0 = &(pSVar5[lVar4 + -1].lex.d.d)->super_QArrayData;
      local_98 = pSVar5[lVar4 + -1].lex.d.ptr;
      qStack_90 = pSVar5[lVar4 + -1].lex.d.size;
      if (pQStack_a0 != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&pQStack_a0->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&pQStack_a0->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_88 = pSVar5[lVar4 + -1].from;
      qStack_80 = pSVar5[lVar4 + -1].len;
      if (local_58.size != 0) {
        lVar6 = local_58.size * 0x30;
        lVar4 = 0;
        do {
          if (lVar6 == lVar4) goto LAB_001408ca;
          bVar2 = Symbol::operator==((Symbol *)((long)&pSVar1->lineNum + lVar4),(Symbol *)&local_a8)
          ;
          lVar4 = lVar4 + 0x30;
        } while (!bVar2);
        if ((long)local_58.ptr - (long)pSVar1 != lVar4) {
          pcVar8 = "Duplicate macro parameter.";
          goto LAB_00140b02;
        }
      }
LAB_001408ca:
      QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol_const&>
                ((QMovableArrayOps<Symbol> *)&local_58,local_58.size,
                 (this->super_Parser).symbols.d.ptr + (this->super_Parser).index + -1);
      QList<Symbol>::end((QList<Symbol> *)&local_58);
      pSVar5 = (this->super_Parser).symbols.d.ptr;
      lVar6 = (this->super_Parser).symbols.d.size;
      lVar4 = (this->super_Parser).index;
      if (lVar4 < lVar6) {
        pTVar7 = &pSVar5[lVar4].token;
        do {
          if (*pTVar7 != PP_WHITESPACE) goto LAB_00140939;
          lVar4 = lVar4 + 1;
          (this->super_Parser).index = lVar4;
          pTVar7 = pTVar7 + 0xc;
        } while (lVar6 != lVar4);
LAB_0014096e:
        QByteArray::mid(&local_78,&pSVar5[lVar6 + -1].lex,pSVar5[lVar6 + -1].from,
                        pSVar5[lVar6 + -1].len);
        local_c0.d.d = (Data *)0x17e2d4;
        bVar2 = operator==(&local_78,(char **)&local_c0);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
          }
        }
        if (!bVar2) goto LAB_00140b0a;
        m->isVariadic = true;
        lVar6 = (this->super_Parser).symbols.d.size;
        lVar4 = (this->super_Parser).index;
        if (lVar4 < lVar6) {
          pTVar7 = &(this->super_Parser).symbols.d.ptr[lVar4].token;
          while (*pTVar7 == PP_WHITESPACE) {
            lVar4 = lVar4 + 1;
            (this->super_Parser).index = lVar4;
            pTVar7 = pTVar7 + 0xc;
            if (lVar6 == lVar4) goto LAB_00140afb;
          }
        }
        if ((lVar6 <= lVar4) || ((this->super_Parser).symbols.d.ptr[lVar4].token != PP_RPAREN))
        goto LAB_00140afb;
        (this->super_Parser).index = lVar4 + 1;
LAB_00140a41:
        iVar9 = 3;
      }
      else {
LAB_00140939:
        bVar2 = lVar6 <= lVar4;
        lVar6 = lVar4;
        if (bVar2) goto LAB_0014096e;
        (this->super_Parser).index = lVar4 + 1;
        if (pSVar5[lVar4].token == PP_RPAREN) goto LAB_00140a41;
        lVar6 = lVar4 + 1;
        if (pSVar5[lVar4].token != COMMA) goto LAB_0014096e;
        iVar9 = 2;
      }
      if (pQStack_a0 != (QArrayData *)0x0) {
        LOCK();
        (pQStack_a0->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQStack_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQStack_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQStack_a0,1,0x10);
        }
      }
    }
  } while (iVar9 != 3);
LAB_00140a74:
  QArrayDataPointer<Symbol>::operator=(&(m->arguments).d,&local_58);
  lVar6 = (this->super_Parser).symbols.d.size;
  lVar4 = (this->super_Parser).index;
  if (lVar4 < lVar6) {
    pTVar7 = &(this->super_Parser).symbols.d.ptr[lVar4].token;
    do {
      lVar4 = lVar4 + 1;
      if (*pTVar7 != PP_WHITESPACE) break;
      (this->super_Parser).index = lVar4;
      pTVar7 = pTVar7 + 0xc;
    } while (lVar4 != lVar6);
  }
  QArrayDataPointer<Symbol>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Preprocessor::parseDefineArguments(Macro *m)
{
    Symbols arguments;
    while (hasNext()) {
        while (test(PP_WHITESPACE)) {}
        Token t = next();
        if (t == PP_RPAREN)
            break;
        if (t != PP_IDENTIFIER) {
            QByteArray l = lexem();
            if (l == "...") {
                m->isVariadic = true;
                arguments += Symbol(symbol().lineNum, PP_IDENTIFIER, "__VA_ARGS__");
                while (test(PP_WHITESPACE)) {}
                if (!test(PP_RPAREN))
                    error("missing ')' in macro argument list");
                break;
            } else if (!is_identifier(l.constData(), l.size())) {
                error("Unexpected character in macro argument list.");
            }
        }

        Symbol arg = symbol();
        if (arguments.contains(arg))
            error("Duplicate macro parameter.");
        arguments += symbol();

        while (test(PP_WHITESPACE)) {}
        t = next();
        if (t == PP_RPAREN)
            break;
        if (t == PP_COMMA)
            continue;
        if (lexem() == "...") {
            //GCC extension:    #define FOO(x, y...) x(y)
            // The last argument was already parsed. Just mark the macro as variadic.
            m->isVariadic = true;
            while (test(PP_WHITESPACE)) {}
            if (!test(PP_RPAREN))
                error("missing ')' in macro argument list");
            break;
        }
        error("Unexpected character in macro argument list.");
    }
    m->arguments = arguments;
    while (test(PP_WHITESPACE)) {}
}